

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O1

HighsStatus __thiscall
Highs::elasticityFilter
          (Highs *this,double global_lower_penalty,double global_upper_penalty,
          double global_rhs_penalty,double *param_4,double *param_5,double *param_6,
          bool get_infeasible_row,vector<int,_std::allocator<int>_> *infeasible_row_subset)

{
  vector<double,_std::allocator<double>_> *__x;
  vector<double,_std::allocator<double>_> *__x_00;
  HighsTimer *this_00;
  pointer *ppHVar1;
  vector<HighsIisInfo,_std::allocator<HighsIisInfo>_> *this_01;
  double dVar2;
  int original_num_col;
  int original_num_row;
  int iVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pcVar6;
  iterator iVar7;
  pointer piVar8;
  iterator __position;
  uint uVar9;
  undefined4 uVar10;
  HighsStatus return_status;
  HighsStatus return_status_00;
  vector<HighsIisInfo,_std::allocator<HighsIisInfo>_> *__n;
  long *plVar11;
  undefined8 *puVar12;
  pointer pHVar13;
  pointer __nbytes;
  ulong uVar14;
  long *plVar15;
  vector<HighsIisInfo,_std::allocator<HighsIisInfo>_> *__nbytes_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar16;
  void *pvVar17;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  void *extraout_RDX_09;
  void *extraout_RDX_10;
  void *extraout_RDX_11;
  void *__buf;
  void *extraout_RDX_12;
  void *extraout_RDX_13;
  void *extraout_RDX_14;
  void *extraout_RDX_15;
  void *__buf_00;
  void *extraout_RDX_16;
  void *extraout_RDX_17;
  void *extraout_RDX_18;
  void *extraout_RDX_19;
  void *extraout_RDX_20;
  HighsInt HVar18;
  long lVar19;
  pointer pbVar20;
  uint uVar21;
  size_t sVar22;
  uint uVar23;
  double *pdVar24;
  size_type __n_00;
  uint uVar25;
  int iVar26;
  bool bVar27;
  ulong extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  ulong extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  uint local_4c0;
  byte local_4ba;
  byte local_4b9;
  vector<HighsVarType,_std::allocator<HighsVarType>_> all_continuous;
  HighsInt evar_ix;
  byte local_489;
  double upper;
  long *local_480;
  long local_478;
  long local_470;
  long lStack_468;
  long *local_460;
  long local_458;
  long local_450;
  long lStack_448;
  long *local_440;
  long local_438;
  long local_430;
  long lStack_428;
  double *local_420;
  vector<double,_std::allocator<double>_> col_lower;
  string __str;
  vector<double,_std::allocator<double>_> col_upper;
  vector<double,_std::allocator<double>_> ecol_cost;
  double upper_penalty;
  vector<int,_std::allocator<int>_> col_of_ecol;
  double lower_penalty;
  double lower;
  iterator iStack_360;
  double *local_358;
  vector<int,_std::allocator<int>_> row_of_ecol;
  vector<int,_std::allocator<int>_> erow_index;
  vector<HighsVarType,_std::allocator<HighsVarType>_> original_integrality;
  vector<double,_std::allocator<double>_> erow_value;
  bool local_2b8;
  vector<int,_std::allocator<int>_> erow_start;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ecol_name;
  vector<double,_std::allocator<double>_> bound_of_col_of_ecol;
  vector<double,_std::allocator<double>_> bound_of_row_of_ecol;
  vector<double,_std::allocator<double>_> erow_upper;
  vector<double,_std::allocator<double>_> erow_lower;
  vector<double,_std::allocator<double>_> ecol_upper;
  vector<double,_std::allocator<double>_> ecol_lower;
  vector<HighsVarType,_std::allocator<HighsVarType>_> local_188;
  vector<double,_std::allocator<double>_> original_col_upper;
  vector<double,_std::allocator<double>_> original_col_lower;
  vector<double,_std::allocator<double>_> original_col_cost;
  vector<HighsVarType,_std::allocator<HighsVarType>_> local_128;
  vector<HighsVarType,_std::allocator<HighsVarType>_> local_108;
  vector<HighsVarType,_std::allocator<HighsVarType>_> local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  erow_name;
  vector<double,_std::allocator<double>_> zero_costs;
  vector<double,_std::allocator<double>_> local_90;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ecol_name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ecol_name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ecol_name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  erow_name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  erow_name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  erow_name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ecol_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ecol_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ecol_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ecol_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ecol_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ecol_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  original_num_col = (this->model_).lp_.num_col_;
  __n = (vector<HighsIisInfo,_std::allocator<HighsIisInfo>_> *)(long)original_num_col;
  original_num_row = (this->model_).lp_.num_row_;
  evar_ix = original_num_col;
  local_420 = param_4;
  std::vector<double,_std::allocator<double>_>::vector
            (&original_col_cost,&(this->model_).lp_.col_cost_);
  __x = &(this->model_).lp_.col_lower_;
  std::vector<double,_std::allocator<double>_>::vector(&original_col_lower,__x);
  __x_00 = &(this->model_).lp_.col_upper_;
  std::vector<double,_std::allocator<double>_>::vector(&original_col_upper,__x_00);
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::vector
            (&original_integrality,&(this->model_).lp_.integrality_);
  zero_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  zero_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  zero_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&zero_costs,(size_type)__n,(value_type_conflict1 *)&all_continuous);
  changeColsCost(this,0,(this->model_).lp_.num_col_ + -1,
                 zero_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start);
  uVar16 = extraout_RDX;
  if ((get_infeasible_row) &&
     ((this->model_).lp_.integrality_.
      super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->model_).lp_.integrality_.
      super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_480 = (long *)((ulong)local_480 & 0xffffffffffffff00);
    std::vector<HighsVarType,_std::allocator<HighsVarType>_>::_M_fill_assign
              (&all_continuous,(size_type)__n,(value_type *)&local_480);
    changeColsIntegrality
              (this,0,(this->model_).lp_.num_col_ + -1,
               all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
               _M_impl.super__Vector_impl_data._M_start);
    uVar16 = extraout_RDX_00;
    if (all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      uVar16 = extraout_RDX_01;
    }
  }
  uVar23 = -(uint)(0.0 <= global_upper_penalty || 0.0 <= global_lower_penalty);
  __nbytes = (pointer)(ulong)uVar23;
  local_4b9 = (param_5 != (double *)0x0 || local_420 != (double *)0x0) | (byte)uVar23;
  pvVar17 = (void *)CONCAT71((int7)((ulong)uVar16 >> 8),local_4b9);
  local_489 = param_6 != (double *)0x0;
  local_4ba = 0.0 <= global_rhs_penalty;
  iVar3 = (this->model_).lp_.num_col_;
  if ((param_5 != (double *)0x0 || local_420 != (double *)0x0) || (uVar23 & 1) != 0) {
    col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    pbVar4 = (this->model_).lp_.col_names_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (this->model_).lp_.col_names_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)all_continuous.
                          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffff00000000);
    if (erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&erow_start,
                 (iterator)
                 erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&all_continuous);
    }
    else {
      *erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = 0;
      erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    local_4c0 = 0;
    iVar26 = (this->model_).lp_.num_col_;
    pdVar24 = local_420;
    if (0 < iVar26) {
      do {
        lower = (__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[(int)local_4c0];
        upper = (__x_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[(int)local_4c0];
        if (col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&col_lower,
                     (iterator)
                     col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&lower);
        }
        else {
          *col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = lower;
          col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&col_upper,
                     (iterator)
                     col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&upper);
        }
        else {
          *col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = upper;
          col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if ((-INFINITY < lower) || (upper < INFINITY)) {
          lower_penalty = global_lower_penalty;
          if (pdVar24 != (double *)0x0) {
            lower_penalty = pdVar24[(int)local_4c0];
          }
          if ((0.0 <= lower_penalty) || (upper < INFINITY)) {
            upper_penalty = global_upper_penalty;
            if (param_5 != (double *)0x0) {
              upper_penalty = param_5[(int)local_4c0];
            }
            if ((-INFINITY < lower) || (0.0 <= upper_penalty)) {
              if (erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          ((vector<double,std::allocator<double>> *)&erow_lower,
                           (iterator)
                           erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,&lower);
              }
              else {
                *erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish = lower;
                erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              if (erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          ((vector<double,std::allocator<double>> *)&erow_upper,
                           (iterator)
                           erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,&upper);
              }
              else {
                *erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish = upper;
                erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              if (pbVar5 != pbVar4) {
                uVar23 = -local_4c0;
                if (0 < (int)local_4c0) {
                  uVar23 = local_4c0;
                }
                uVar25 = 1;
                if (9 < uVar23) {
                  uVar14 = (ulong)uVar23;
                  uVar21 = 4;
                  do {
                    uVar25 = uVar21;
                    uVar9 = (uint)uVar14;
                    if (uVar9 < 100) {
                      uVar25 = uVar25 - 2;
                      goto LAB_00234ba3;
                    }
                    if (uVar9 < 1000) {
                      uVar25 = uVar25 - 1;
                      goto LAB_00234ba3;
                    }
                    if (uVar9 < 10000) goto LAB_00234ba3;
                    uVar14 = uVar14 / 10000;
                    uVar21 = uVar25 + 4;
                  } while (99999 < uVar9);
                  uVar25 = uVar25 + 1;
                }
LAB_00234ba3:
                uVar21 = local_4c0 >> 0x1f;
                __str._M_dataplus._M_p = (pointer)&__str.field_2;
                std::__cxx11::string::_M_construct
                          ((ulong)&__str,(char)uVar25 - (char)((int)local_4c0 >> 0x1f));
                std::__detail::__to_chars_10_impl<unsigned_int>
                          (__str._M_dataplus._M_p + uVar21,uVar25,uVar23);
                plVar11 = (long *)std::__cxx11::string::replace
                                            ((ulong)&__str,0,(char *)0x0,0x3cf4c9);
                pdVar24 = local_420;
                plVar15 = plVar11 + 2;
                if ((long *)*plVar11 == plVar15) {
                  local_430 = *plVar15;
                  lStack_428 = plVar11[3];
                  local_440 = &local_430;
                }
                else {
                  local_430 = *plVar15;
                  local_440 = (long *)*plVar11;
                }
                local_438 = plVar11[1];
                *plVar11 = (long)plVar15;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                plVar11 = (long *)std::__cxx11::string::append((char *)&local_440);
                local_460 = &local_450;
                plVar15 = plVar11 + 2;
                if ((long *)*plVar11 == plVar15) {
                  local_450 = *plVar15;
                  lStack_448 = plVar11[3];
                }
                else {
                  local_450 = *plVar15;
                  local_460 = (long *)*plVar11;
                }
                local_458 = plVar11[1];
                *plVar11 = (long)plVar15;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                plVar11 = (long *)std::__cxx11::string::_M_append
                                            ((char *)&local_460,
                                             (ulong)(this->model_).lp_.col_names_.
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(int)local_4c0]._M_dataplus._M_p);
                local_480 = &local_470;
                plVar15 = plVar11 + 2;
                if ((long *)*plVar11 == plVar15) {
                  local_470 = *plVar15;
                  lStack_468 = plVar11[3];
                }
                else {
                  local_470 = *plVar15;
                  local_480 = (long *)*plVar11;
                }
                local_478 = plVar11[1];
                *plVar11 = (long)plVar15;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                plVar11 = (long *)std::__cxx11::string::append((char *)&local_480);
                all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     (pointer)&all_continuous.
                               super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage;
                pHVar13 = (pointer)(plVar11 + 2);
                if ((pointer)*plVar11 == pHVar13) {
                  all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pHVar13;
                }
                else {
                  all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pHVar13;
                  all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar11;
                }
                all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar11[1];
                *plVar11 = (long)pHVar13;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &erow_name,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &all_continuous);
                if ((pointer *)
                    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                    _M_impl.super__Vector_impl_data._M_start !=
                    &all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  operator_delete(all_continuous.
                                  super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_480 != &local_470) {
                  operator_delete(local_480);
                }
                if (local_460 != &local_450) {
                  operator_delete(local_460);
                }
                if (local_440 != &local_430) {
                  operator_delete(local_440);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)__str._M_dataplus._M_p != &__str.field_2) {
                  operator_delete(__str._M_dataplus._M_p);
                }
              }
              if (erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&erow_index,
                           (iterator)
                           erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)&local_4c0);
              }
              else {
                *erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_4c0;
                erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
              .super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
              if (erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          (&erow_value,
                           (iterator)
                           erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,(double *)&all_continuous);
              }
              else {
                *erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish = 1.0;
                erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              if ((lower != -INFINITY) && (0.0 <= lower_penalty)) {
                if (col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&col_of_ecol,
                             (iterator)
                             col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,(int *)&local_4c0);
                }
                else {
                  *col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = local_4c0;
                  col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                if (pbVar5 != pbVar4) {
                  uVar23 = -local_4c0;
                  if (0 < (int)local_4c0) {
                    uVar23 = local_4c0;
                  }
                  uVar25 = 1;
                  if (9 < uVar23) {
                    uVar14 = (ulong)uVar23;
                    uVar21 = 4;
                    do {
                      uVar25 = uVar21;
                      uVar9 = (uint)uVar14;
                      if (uVar9 < 100) {
                        uVar25 = uVar25 - 2;
                        goto LAB_00234f6b;
                      }
                      if (uVar9 < 1000) {
                        uVar25 = uVar25 - 1;
                        goto LAB_00234f6b;
                      }
                      if (uVar9 < 10000) goto LAB_00234f6b;
                      uVar14 = uVar14 / 10000;
                      uVar21 = uVar25 + 4;
                    } while (99999 < uVar9);
                    uVar25 = uVar25 + 1;
                  }
LAB_00234f6b:
                  uVar21 = local_4c0 >> 0x1f;
                  __str._M_dataplus._M_p = (pointer)&__str.field_2;
                  std::__cxx11::string::_M_construct
                            ((ulong)&__str,(char)uVar25 - (char)((int)local_4c0 >> 0x1f));
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            (__str._M_dataplus._M_p + uVar21,uVar25,uVar23);
                  puVar12 = (undefined8 *)
                            std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x3cf4d4);
                  pdVar24 = local_420;
                  plVar11 = puVar12 + 2;
                  if ((long *)*puVar12 == plVar11) {
                    local_430 = *plVar11;
                    lStack_428 = puVar12[3];
                    local_440 = &local_430;
                  }
                  else {
                    local_430 = *plVar11;
                    local_440 = (long *)*puVar12;
                  }
                  local_438 = puVar12[1];
                  *puVar12 = plVar11;
                  puVar12[1] = 0;
                  *(undefined1 *)(puVar12 + 2) = 0;
                  puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_440);
                  local_460 = &local_450;
                  plVar11 = puVar12 + 2;
                  if ((long *)*puVar12 == plVar11) {
                    local_450 = *plVar11;
                    lStack_448 = puVar12[3];
                  }
                  else {
                    local_450 = *plVar11;
                    local_460 = (long *)*puVar12;
                  }
                  local_458 = puVar12[1];
                  *puVar12 = plVar11;
                  puVar12[1] = 0;
                  *(undefined1 *)(puVar12 + 2) = 0;
                  puVar12 = (undefined8 *)
                            std::__cxx11::string::_M_append
                                      ((char *)&local_460,
                                       (ulong)(this->model_).lp_.col_names_.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [(int)local_4c0]._M_dataplus._M_p);
                  local_480 = &local_470;
                  plVar11 = puVar12 + 2;
                  if ((long *)*puVar12 == plVar11) {
                    local_470 = *plVar11;
                    lStack_468 = puVar12[3];
                  }
                  else {
                    local_470 = *plVar11;
                    local_480 = (long *)*puVar12;
                  }
                  local_478 = puVar12[1];
                  *puVar12 = plVar11;
                  puVar12[1] = 0;
                  *(undefined1 *)(puVar12 + 2) = 0;
                  plVar11 = (long *)std::__cxx11::string::append((char *)&local_480);
                  all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)&all_continuous.
                                 super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage;
                  pHVar13 = (pointer)(plVar11 + 2);
                  if ((pointer)*plVar11 == pHVar13) {
                    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pHVar13;
                  }
                  else {
                    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pHVar13;
                    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar11;
                  }
                  all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar11[1];
                  *plVar11 = (long)pHVar13;
                  plVar11[1] = 0;
                  *(undefined1 *)(plVar11 + 2) = 0;
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &ecol_name,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &all_continuous);
                  if ((pointer *)
                      all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      &all_continuous.
                       super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage) {
                    operator_delete(all_continuous.
                                    super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_480 != &local_470) {
                    operator_delete(local_480);
                  }
                  if (local_460 != &local_450) {
                    operator_delete(local_460);
                  }
                  if (local_440 != &local_430) {
                    operator_delete(local_440);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)__str._M_dataplus._M_p != &__str.field_2) {
                    operator_delete(__str._M_dataplus._M_p);
                  }
                }
                if (bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_finish ==
                    bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                            ((vector<double,std::allocator<double>> *)&bound_of_col_of_ecol,
                             (iterator)
                             bound_of_col_of_ecol.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,&lower);
                }
                else {
                  *bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish = lower;
                  bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[(int)local_4c0] = -INFINITY;
                if (erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&erow_index,
                             (iterator)
                             erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,&evar_ix);
                }
                else {
                  *erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = evar_ix;
                  erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
                if (erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                            (&erow_value,
                             (iterator)
                             erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,(double *)&all_continuous);
                }
                else {
                  *erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish = 1.0;
                  erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                if (ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                            ((vector<double,std::allocator<double>> *)&ecol_cost,
                             (iterator)
                             ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,&lower_penalty);
                }
                else {
                  *ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish = lower_penalty;
                  ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                evar_ix = evar_ix + 1;
              }
              if ((upper != INFINITY) && (0.0 <= upper_penalty)) {
                if (col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&col_of_ecol,
                             (iterator)
                             col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,(int *)&local_4c0);
                }
                else {
                  *col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = local_4c0;
                  col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                if (pbVar5 != pbVar4) {
                  uVar23 = -local_4c0;
                  if (0 < (int)local_4c0) {
                    uVar23 = local_4c0;
                  }
                  uVar25 = 1;
                  if (9 < uVar23) {
                    uVar14 = (ulong)uVar23;
                    uVar21 = 4;
                    do {
                      uVar25 = uVar21;
                      uVar9 = (uint)uVar14;
                      if (uVar9 < 100) {
                        uVar25 = uVar25 - 2;
                        goto LAB_002353d3;
                      }
                      if (uVar9 < 1000) {
                        uVar25 = uVar25 - 1;
                        goto LAB_002353d3;
                      }
                      if (uVar9 < 10000) goto LAB_002353d3;
                      uVar14 = uVar14 / 10000;
                      uVar21 = uVar25 + 4;
                    } while (99999 < uVar9);
                    uVar25 = uVar25 + 1;
                  }
LAB_002353d3:
                  uVar21 = local_4c0 >> 0x1f;
                  __str._M_dataplus._M_p = (pointer)&__str.field_2;
                  std::__cxx11::string::_M_construct
                            ((ulong)&__str,(char)uVar25 - (char)((int)local_4c0 >> 0x1f));
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            (__str._M_dataplus._M_p + uVar21,uVar25,uVar23);
                  puVar12 = (undefined8 *)
                            std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x3cf4d4);
                  pdVar24 = local_420;
                  plVar11 = puVar12 + 2;
                  if ((long *)*puVar12 == plVar11) {
                    local_430 = *plVar11;
                    lStack_428 = puVar12[3];
                    local_440 = &local_430;
                  }
                  else {
                    local_430 = *plVar11;
                    local_440 = (long *)*puVar12;
                  }
                  local_438 = puVar12[1];
                  *puVar12 = plVar11;
                  puVar12[1] = 0;
                  *(undefined1 *)(puVar12 + 2) = 0;
                  puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_440);
                  local_460 = &local_450;
                  plVar11 = puVar12 + 2;
                  if ((long *)*puVar12 == plVar11) {
                    local_450 = *plVar11;
                    lStack_448 = puVar12[3];
                  }
                  else {
                    local_450 = *plVar11;
                    local_460 = (long *)*puVar12;
                  }
                  local_458 = puVar12[1];
                  *puVar12 = plVar11;
                  puVar12[1] = 0;
                  *(undefined1 *)(puVar12 + 2) = 0;
                  puVar12 = (undefined8 *)
                            std::__cxx11::string::_M_append
                                      ((char *)&local_460,
                                       (ulong)(this->model_).lp_.col_names_.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [(int)local_4c0]._M_dataplus._M_p);
                  local_480 = &local_470;
                  plVar11 = puVar12 + 2;
                  if ((long *)*puVar12 == plVar11) {
                    local_470 = *plVar11;
                    lStack_468 = puVar12[3];
                  }
                  else {
                    local_470 = *plVar11;
                    local_480 = (long *)*puVar12;
                  }
                  local_478 = puVar12[1];
                  *puVar12 = plVar11;
                  puVar12[1] = 0;
                  *(undefined1 *)(puVar12 + 2) = 0;
                  plVar11 = (long *)std::__cxx11::string::append((char *)&local_480);
                  all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)&all_continuous.
                                 super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage;
                  pHVar13 = (pointer)(plVar11 + 2);
                  if ((pointer)*plVar11 == pHVar13) {
                    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pHVar13;
                  }
                  else {
                    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pHVar13;
                    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar11;
                  }
                  all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar11[1];
                  *plVar11 = (long)pHVar13;
                  plVar11[1] = 0;
                  *(undefined1 *)(plVar11 + 2) = 0;
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &ecol_name,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &all_continuous);
                  if ((pointer *)
                      all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      &all_continuous.
                       super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage) {
                    operator_delete(all_continuous.
                                    super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_480 != &local_470) {
                    operator_delete(local_480);
                  }
                  if (local_460 != &local_450) {
                    operator_delete(local_460);
                  }
                  if (local_440 != &local_430) {
                    operator_delete(local_440);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)__str._M_dataplus._M_p != &__str.field_2) {
                    operator_delete(__str._M_dataplus._M_p);
                  }
                }
                if (bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_finish ==
                    bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                            ((vector<double,std::allocator<double>> *)&bound_of_col_of_ecol,
                             (iterator)
                             bound_of_col_of_ecol.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,&upper);
                }
                else {
                  *bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish = upper;
                  bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[(int)local_4c0] = INFINITY;
                if (erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&erow_index,
                             (iterator)
                             erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,&evar_ix);
                }
                else {
                  *erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = evar_ix;
                  erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0xbff0000000000000;
                if (erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                            (&erow_value,
                             (iterator)
                             erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,(double *)&all_continuous);
                }
                else {
                  *erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish = -1.0;
                  erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                if (ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                            ((vector<double,std::allocator<double>> *)&ecol_cost,
                             (iterator)
                             ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,&upper_penalty);
                }
                else {
                  *ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish = upper_penalty;
                  ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                evar_ix = evar_ix + 1;
              }
              iVar26 = (int)((ulong)((long)erow_index.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)erow_index.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 2);
              all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
              .super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(all_continuous.
                                     super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar26);
              if (erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&erow_start,
                           (iterator)
                           erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)&all_continuous);
              }
              else {
                *erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = iVar26;
                erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
          }
        }
        local_4c0 = local_4c0 + 1;
        iVar26 = (this->model_).lp_.num_col_;
      } while ((int)local_4c0 < iVar26);
    }
    uVar14 = (long)col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
    uVar23 = (int)((ulong)((long)erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2) - 1;
    HVar18 = erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[(int)uVar23];
    changeColsBounds(this,0,iVar26 + -1,
                     col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
    uVar25 = (uint)(uVar14 >> 2);
    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&ecol_lower,(long)(int)uVar25,(value_type_conflict1 *)&all_continuous);
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&ecol_upper,(long)(int)uVar25,(value_type_conflict1 *)&kHighsInf);
    addCols(this,uVar25,
            ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,
            ecol_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,
            ecol_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,0,(HighsInt *)0x0,(HighsInt *)0x0,(double *)0x0);
    __nbytes = erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    addRows(this,uVar23,
            erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,
            erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,HVar18,
            erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start,
            erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start,
            erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start);
    pvVar17 = extraout_RDX_02;
    if (pbVar5 != pbVar4) {
      if (0 < (int)uVar25) {
        uVar14 = (ulong)(uVar25 & 0x7fffffff);
        lVar19 = 0;
        HVar18 = iVar3;
        do {
          passColName(this,HVar18,
                      (string *)
                      ((long)&((ecol_name.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar19));
          HVar18 = HVar18 + 1;
          lVar19 = lVar19 + 0x20;
          uVar14 = uVar14 - 1;
          pvVar17 = extraout_RDX_03;
        } while (uVar14 != 0);
      }
      if (0 < (int)uVar23) {
        lVar19 = 0;
        HVar18 = original_num_row;
        do {
          passRowName(this,HVar18,
                      (string *)
                      ((long)&((erow_name.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar19));
          HVar18 = HVar18 + 1;
          lVar19 = lVar19 + 0x20;
          pvVar17 = extraout_RDX_04;
        } while ((ulong)uVar23 << 5 != lVar19);
      }
    }
    if (col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
      pvVar17 = extraout_RDX_05;
    }
    if (col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
      pvVar17 = extraout_RDX_06;
    }
  }
  pbVar5 = ecol_name.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar4 = ecol_name.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_4ba = local_4ba | local_489;
  local_420 = (double *)(ulong)(uint)(this->model_).lp_.num_col_;
  if (local_4ba != 0) {
    pbVar20 = ecol_name.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ecol_name.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        ecol_name.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        pcVar6 = (pbVar20->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar6 != &pbVar20->field_2) {
          operator_delete(pcVar6);
        }
        pbVar20 = pbVar20 + 1;
      } while (pbVar20 != pbVar5);
      ecol_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
    }
    if (ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_358 = (double *)0x0;
    lower = 0.0;
    iStack_360._M_current = (double *)0x0;
    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)all_continuous.
                          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)&col_lower,(iterator)0x0,(int *)&all_continuous)
    ;
    pbVar4 = (this->model_).lp_.row_names_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (this->model_).lp_.row_names_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_4c0 = 0;
    if (0 < original_num_row) {
      do {
        lVar19 = (long)(int)local_4c0;
        upper = global_rhs_penalty;
        if (param_6 != (double *)0x0) {
          upper = param_6[lVar19];
        }
        if (0.0 <= upper) {
          lower_penalty =
               (this->model_).lp_.row_lower_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar19];
          upper_penalty =
               (this->model_).lp_.row_upper_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar19];
          if (lower_penalty != -INFINITY) {
            if (row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&row_of_ecol,
                         (iterator)
                         row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&local_4c0);
            }
            else {
              *row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_4c0;
              row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            if (pbVar5 != pbVar4) {
              uVar23 = -local_4c0;
              if (0 < (int)local_4c0) {
                uVar23 = local_4c0;
              }
              uVar25 = 1;
              if (9 < uVar23) {
                uVar14 = (ulong)uVar23;
                uVar21 = 4;
                do {
                  uVar25 = uVar21;
                  uVar9 = (uint)uVar14;
                  if (uVar9 < 100) {
                    uVar25 = uVar25 - 2;
                    goto LAB_00235bb0;
                  }
                  if (uVar9 < 1000) {
                    uVar25 = uVar25 - 1;
                    goto LAB_00235bb0;
                  }
                  if (uVar9 < 10000) goto LAB_00235bb0;
                  uVar14 = uVar14 / 10000;
                  uVar21 = uVar25 + 4;
                } while (99999 < uVar9);
                uVar25 = uVar25 + 1;
              }
LAB_00235bb0:
              uVar21 = local_4c0 >> 0x1f;
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              std::__cxx11::string::_M_construct
                        ((ulong)&__str,(char)uVar25 - (char)((int)local_4c0 >> 0x1f));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (__str._M_dataplus._M_p + uVar21,uVar25,uVar23);
              puVar12 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x3cf4c9);
              plVar11 = puVar12 + 2;
              if ((long *)*puVar12 == plVar11) {
                local_430 = *plVar11;
                lStack_428 = puVar12[3];
                local_440 = &local_430;
              }
              else {
                local_430 = *plVar11;
                local_440 = (long *)*puVar12;
              }
              local_438 = puVar12[1];
              *puVar12 = plVar11;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_440);
              local_460 = &local_450;
              plVar11 = puVar12 + 2;
              if ((long *)*puVar12 == plVar11) {
                local_450 = *plVar11;
                lStack_448 = puVar12[3];
              }
              else {
                local_450 = *plVar11;
                local_460 = (long *)*puVar12;
              }
              local_458 = puVar12[1];
              *puVar12 = plVar11;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              puVar12 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_460,
                                   (ulong)(this->model_).lp_.row_names_.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[(int)local_4c0].
                                          _M_dataplus._M_p);
              local_480 = &local_470;
              plVar11 = puVar12 + 2;
              if ((long *)*puVar12 == plVar11) {
                local_470 = *plVar11;
                lStack_468 = puVar12[3];
              }
              else {
                local_470 = *plVar11;
                local_480 = (long *)*puVar12;
              }
              local_478 = puVar12[1];
              *puVar12 = plVar11;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_480);
              all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
              .super__Vector_impl_data._M_start =
                   (pointer)&all_continuous.
                             super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage;
              pHVar13 = (pointer)(plVar11 + 2);
              if ((pointer)*plVar11 == pHVar13) {
                all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pHVar13;
              }
              else {
                all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pHVar13;
                all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar11;
              }
              all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
              .super__Vector_impl_data._M_finish = (pointer)plVar11[1];
              *plVar11 = (long)pHVar13;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &ecol_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &all_continuous);
              if ((pointer *)
                  all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  &all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(all_continuous.
                                super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_480 != &local_470) {
                operator_delete(local_480);
              }
              if (local_460 != &local_450) {
                operator_delete(local_460);
              }
              if (local_440 != &local_430) {
                operator_delete(local_440);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p);
              }
            }
            if (bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)&bound_of_row_of_ecol,
                         (iterator)
                         bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&lower_penalty);
            }
            else {
              *bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish = lower_penalty;
              bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            if (col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&col_upper,
                         (iterator)
                         col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&local_4c0);
            }
            else {
              *(uint *)col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish = local_4c0;
              col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)((long)col_upper.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish + 4);
            }
            all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
            if (iStack_360._M_current == local_358) {
              std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                        ((vector<double,_std::allocator<double>_> *)&lower,iStack_360,
                         (double *)&all_continuous);
            }
            else {
              *iStack_360._M_current = 1.0;
              iStack_360._M_current = iStack_360._M_current + 1;
            }
            uVar10 = (undefined4)
                     ((ulong)((long)col_upper.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)col_upper.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2);
            all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(all_continuous.
                                   super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,uVar10);
            if (col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)&col_lower,
                         (iterator)
                         col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&all_continuous);
            }
            else {
              *(undefined4 *)
               col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish = uVar10;
              col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)((long)col_lower.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish + 4);
            }
            if (ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)&ecol_cost,
                         (iterator)
                         ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,&upper);
            }
            else {
              *ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish = upper;
              ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            evar_ix = evar_ix + 1;
          }
          if (upper_penalty != INFINITY) {
            if (row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&row_of_ecol,
                         (iterator)
                         row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&local_4c0);
            }
            else {
              *row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_4c0;
              row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            if (pbVar5 != pbVar4) {
              uVar23 = -local_4c0;
              if (0 < (int)local_4c0) {
                uVar23 = local_4c0;
              }
              uVar25 = 1;
              if (9 < uVar23) {
                uVar14 = (ulong)uVar23;
                uVar21 = 4;
                do {
                  uVar25 = uVar21;
                  uVar9 = (uint)uVar14;
                  if (uVar9 < 100) {
                    uVar25 = uVar25 - 2;
                    goto LAB_0023601a;
                  }
                  if (uVar9 < 1000) {
                    uVar25 = uVar25 - 1;
                    goto LAB_0023601a;
                  }
                  if (uVar9 < 10000) goto LAB_0023601a;
                  uVar14 = uVar14 / 10000;
                  uVar21 = uVar25 + 4;
                } while (99999 < uVar9);
                uVar25 = uVar25 + 1;
              }
LAB_0023601a:
              uVar21 = local_4c0 >> 0x1f;
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              std::__cxx11::string::_M_construct
                        ((ulong)&__str,(char)uVar25 - (char)((int)local_4c0 >> 0x1f));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (__str._M_dataplus._M_p + uVar21,uVar25,uVar23);
              puVar12 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x3cf4c9);
              plVar11 = puVar12 + 2;
              if ((long *)*puVar12 == plVar11) {
                local_430 = *plVar11;
                lStack_428 = puVar12[3];
                local_440 = &local_430;
              }
              else {
                local_430 = *plVar11;
                local_440 = (long *)*puVar12;
              }
              local_438 = puVar12[1];
              *puVar12 = plVar11;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_440);
              local_460 = &local_450;
              plVar11 = puVar12 + 2;
              if ((long *)*puVar12 == plVar11) {
                local_450 = *plVar11;
                lStack_448 = puVar12[3];
              }
              else {
                local_450 = *plVar11;
                local_460 = (long *)*puVar12;
              }
              local_458 = puVar12[1];
              *puVar12 = plVar11;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              puVar12 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_460,
                                   (ulong)(this->model_).lp_.row_names_.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[(int)local_4c0].
                                          _M_dataplus._M_p);
              local_480 = &local_470;
              plVar11 = puVar12 + 2;
              if ((long *)*puVar12 == plVar11) {
                local_470 = *plVar11;
                lStack_468 = puVar12[3];
              }
              else {
                local_470 = *plVar11;
                local_480 = (long *)*puVar12;
              }
              local_478 = puVar12[1];
              *puVar12 = plVar11;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_480);
              all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
              .super__Vector_impl_data._M_start =
                   (pointer)&all_continuous.
                             super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage;
              pHVar13 = (pointer)(plVar11 + 2);
              if ((pointer)*plVar11 == pHVar13) {
                all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pHVar13;
              }
              else {
                all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pHVar13;
                all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar11;
              }
              all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
              .super__Vector_impl_data._M_finish = (pointer)plVar11[1];
              *plVar11 = (long)pHVar13;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &ecol_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &all_continuous);
              if ((pointer *)
                  all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  &all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(all_continuous.
                                super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_480 != &local_470) {
                operator_delete(local_480);
              }
              if (local_460 != &local_450) {
                operator_delete(local_460);
              }
              if (local_440 != &local_430) {
                operator_delete(local_440);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p);
              }
            }
            if (bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)&bound_of_row_of_ecol,
                         (iterator)
                         bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&upper_penalty);
            }
            else {
              *bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish = upper_penalty;
              bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            if (col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&col_upper,
                         (iterator)
                         col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&local_4c0);
            }
            else {
              *(uint *)col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish = local_4c0;
              col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)((long)col_upper.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish + 4);
            }
            all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0xbff0000000000000;
            if (iStack_360._M_current == local_358) {
              std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                        ((vector<double,_std::allocator<double>_> *)&lower,iStack_360,
                         (double *)&all_continuous);
            }
            else {
              *iStack_360._M_current = -1.0;
              iStack_360._M_current = iStack_360._M_current + 1;
            }
            uVar10 = (undefined4)
                     ((ulong)((long)col_upper.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)col_upper.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2);
            all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(all_continuous.
                                   super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,uVar10);
            if (col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)&col_lower,
                         (iterator)
                         col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&all_continuous);
            }
            else {
              *(undefined4 *)
               col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish = uVar10;
              col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)((long)col_lower.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish + 4);
            }
            if (ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)&ecol_cost,
                         (iterator)
                         ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,&upper);
            }
            else {
              *ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish = upper;
              ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            evar_ix = evar_ix + 1;
          }
        }
        local_4c0 = local_4c0 + 1;
      } while ((int)local_4c0 < original_num_row);
    }
    iVar26 = (int)((ulong)((long)col_lower.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)col_lower.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2) + -1;
    __n_00 = (size_type)iVar26;
    HVar18 = *(HighsInt *)
              ((long)col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + __n_00 * 4);
    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&ecol_lower,__n_00,(value_type_conflict1 *)&all_continuous);
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&ecol_upper,__n_00,(value_type_conflict1 *)&kHighsInf);
    __nbytes = ecol_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    addCols(this,iVar26,
            ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,
            ecol_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,
            ecol_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,HVar18,
            (HighsInt *)
            col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,
            (HighsInt *)
            col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,(double *)lower);
    pvVar17 = extraout_RDX_07;
    if ((pbVar5 != pbVar4) && (0 < iVar26)) {
      lVar19 = 0;
      uVar14 = (ulong)local_420 & 0xffffffff;
      do {
        passColName(this,(int)uVar14,
                    (string *)
                    ((long)&((ecol_name.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar19
                    ));
        uVar14 = (ulong)((int)uVar14 + 1);
        lVar19 = lVar19 + 0x20;
        pvVar17 = extraout_RDX_08;
      } while (__n_00 * 0x20 != lVar19);
    }
    if (lower != 0.0) {
      operator_delete((void *)lower);
      pvVar17 = extraout_RDX_09;
    }
    if (col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
      pvVar17 = extraout_RDX_10;
    }
    if (col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
      pvVar17 = extraout_RDX_11;
    }
  }
  all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)all_continuous.
                        super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffff00000000);
  this_00 = &this->timer_;
  HighsTimer::read(this_00,0,pvVar17,(size_t)__nbytes);
  all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)(extraout_XMM0_Qa ^ 0x8000000000000000);
  all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(all_continuous.
                         super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                         super__Vector_impl_data._M_finish._4_4_,
                         -(this->info_).super_HighsInfoStruct.simplex_iteration_count);
  return_status = run(this);
  if (return_status == kOk) {
    HighsTimer::read(this_00,0,__buf,(size_t)__nbytes);
    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(extraout_XMM0_Qa_00 +
                  (double)all_continuous.
                          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                          super__Vector_impl_data._M_start);
    all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(all_continuous.
                           super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                           super__Vector_impl_data._M_finish._4_4_,
                           (int)all_continuous.
                                super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                           (this->info_).super_HighsInfoStruct.simplex_iteration_count);
    iVar7._M_current =
         (this->iis_).info_.super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar7._M_current ==
        (this->iis_).info_.super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<HighsIisInfo,std::allocator<HighsIisInfo>>::_M_realloc_insert<HighsIisInfo_const&>
                ((vector<HighsIisInfo,std::allocator<HighsIisInfo>> *)&(this->iis_).info_,iVar7,
                 (HighsIisInfo *)&all_continuous);
      pvVar17 = extraout_RDX_13;
    }
    else {
      (iVar7._M_current)->simplex_time =
           (double)all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      *(pointer *)&(iVar7._M_current)->simplex_iterations =
           all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
           super__Vector_impl_data._M_finish;
      ppHVar1 = &(this->iis_).info_.super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppHVar1 = *ppHVar1 + 1;
      pvVar17 = extraout_RDX_12;
    }
    if (get_infeasible_row) {
      lVar19 = (long)(int)local_420;
      this_01 = &(this->iis_).info_;
      uVar23 = 0;
      local_2b8 = false;
      __nbytes_00 = this_01;
      do {
        iVar26 = 0;
        if (((local_4b9 & 1) != 0) &&
           (col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start)) {
          uVar14 = 0;
          iVar26 = 0;
          do {
            dVar2 = (this->solution_).col_value.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[(long)iVar3 + uVar14];
            pdVar24 = &(this->options_).super_HighsOptionsStruct.primal_feasibility_tolerance;
            if (*pdVar24 <= dVar2 && dVar2 != *pdVar24) {
              changeColBounds(this,iVar3 + (int)uVar14,0.0,0.0);
              iVar26 = iVar26 + 1;
              pvVar17 = extraout_RDX_14;
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 < (ulong)((long)col_of_ecol.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    (long)col_of_ecol.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start >> 2));
        }
        if ((local_4ba != 0) &&
           (row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start)) {
          uVar14 = 0;
          do {
            dVar2 = (this->solution_).col_value.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar19 + uVar14];
            pdVar24 = &(this->options_).super_HighsOptionsStruct.primal_feasibility_tolerance;
            if (*pdVar24 <= dVar2 && dVar2 != *pdVar24) {
              changeColBounds(this,(int)local_420 + (int)uVar14,0.0,0.0);
              iVar26 = iVar26 + 1;
              pvVar17 = extraout_RDX_15;
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 < (ulong)((long)row_of_ecol.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    (long)row_of_ecol.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start >> 2));
        }
        if (iVar26 == 0) {
          iVar26 = 0x11;
          local_2b8 = true;
        }
        else {
          all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((ulong)all_continuous.
                                super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                _M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
          HighsTimer::read(this_00,0,pvVar17,(size_t)__nbytes_00);
          all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)(extraout_XMM0_Qa_01 ^ 0x8000000000000000);
          all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(all_continuous.
                                 super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 -(this->info_).super_HighsInfoStruct.simplex_iteration_count);
          return_status_00 = run(this);
          if (return_status_00 == kOk) {
            HighsTimer::read(this_00,0,__buf_00,(size_t)__nbytes_00);
            all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)(extraout_XMM0_Qa_02 +
                          (double)all_continuous.
                                  super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
            all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)CONCAT44(all_continuous.
                                   super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                   _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)all_continuous.
                                        super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                   (this->info_).super_HighsInfoStruct.simplex_iteration_count);
            iVar7._M_current =
                 (this->iis_).info_.super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar7._M_current ==
                (this->iis_).info_.super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<HighsIisInfo,std::allocator<HighsIisInfo>>::
              _M_realloc_insert<HighsIisInfo_const&>
                        ((vector<HighsIisInfo,std::allocator<HighsIisInfo>> *)this_01,iVar7,
                         (HighsIisInfo *)&all_continuous);
              pvVar17 = extraout_RDX_17;
            }
            else {
              (iVar7._M_current)->simplex_time =
                   (double)all_continuous.
                           super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                           super__Vector_impl_data._M_start;
              *(pointer *)&(iVar7._M_current)->simplex_iterations =
                   all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              ppHVar1 = &(this->iis_).info_.
                         super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppHVar1 = *ppHVar1 + 1;
              pvVar17 = extraout_RDX_16;
            }
            bVar27 = this->model_status_ != kInfeasible;
            __nbytes_00 = (vector<HighsIisInfo,_std::allocator<HighsIisInfo>_> *)0x0;
            iVar26 = 0x11;
            if (bVar27) {
              iVar26 = 0;
            }
            uVar23 = uVar23 + bVar27;
          }
          else {
            std::vector<double,_std::allocator<double>_>::vector(&local_90,&original_col_upper);
            local_188.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_188.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_188.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            uVar14 = (long)original_integrality.
                           super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)original_integrality.
                           super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                           super__Vector_impl_data._M_start;
            if (uVar14 == 0) {
              pHVar13 = (pointer)0x0;
            }
            else {
              if ((long)uVar14 < 0) {
                std::__throw_bad_alloc();
              }
              pHVar13 = (pointer)operator_new(uVar14);
            }
            local_188.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = pHVar13 + uVar14;
            sVar22 = (long)original_integrality.
                           super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)original_integrality.
                           super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                           super__Vector_impl_data._M_start;
            local_188.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_start = pHVar13;
            if (sVar22 != 0) {
              local_188.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
              super__Vector_impl_data._M_finish = pHVar13;
              memmove(pHVar13,original_integrality.
                              super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                              _M_impl.super__Vector_impl_data._M_start,sVar22);
            }
            local_188.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_finish = pHVar13 + sVar22;
            __nbytes_00 = __n;
            elasticityFilterReturn
                      (this,return_status_00,local_2b8,original_num_col,original_num_row,
                       &original_col_cost,&original_col_lower,&local_90,&local_188);
            pvVar17 = extraout_RDX_18;
            if (pHVar13 != (pointer)0x0) {
              operator_delete(pHVar13);
              pvVar17 = extraout_RDX_19;
            }
            iVar26 = 1;
            return_status = return_status_00;
            if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
              pvVar17 = extraout_RDX_20;
            }
          }
        }
      } while (iVar26 == 0);
      if (iVar26 != 0x11) goto LAB_00236694;
      piVar8 = (infeasible_row_subset->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((infeasible_row_subset->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish != piVar8) {
        (infeasible_row_subset->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = piVar8;
      }
      uVar25 = 0;
      uVar21 = 0;
      if (((local_4b9 & 1) != 0) &&
         (col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start)) {
        uVar14 = 0;
        uVar21 = 0;
        do {
          dVar2 = (__x_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[(long)iVar3 + uVar14];
          if ((dVar2 == 0.0) && (!NAN(dVar2))) {
            uVar21 = uVar21 + 1;
            printf("Col e-col %2d (column %2d) corresponds to column %2d with bound %g and is enforced\n"
                   ,bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar14],uVar14 & 0xffffffff,
                   (ulong)(uint)(iVar3 + (int)uVar14),
                   (ulong)(uint)col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar14]);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < (ulong)((long)col_of_ecol.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)col_of_ecol.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 2));
      }
      if ((local_4ba != 0) &&
         (row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start)) {
        uVar14 = 0;
        uVar25 = 0;
        do {
          all_continuous.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(all_continuous.
                                 super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar14]);
          dVar2 = (__x_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar19 + uVar14];
          if ((dVar2 == 0.0) && (!NAN(dVar2))) {
            uVar25 = uVar25 + 1;
            __position._M_current =
                 (infeasible_row_subset->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (infeasible_row_subset->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)infeasible_row_subset,__position,
                         (int *)&all_continuous);
            }
            else {
              *__position._M_current =
                   row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar14];
              (infeasible_row_subset->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < (ulong)((long)row_of_ecol.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)row_of_ecol.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 2));
      }
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                   "Elasticity filter after %d passes enforces bounds on %d cols and %d rows\n",
                   (ulong)uVar23,(ulong)uVar21,(ulong)uVar25);
      std::vector<double,_std::allocator<double>_>::vector(&local_78,&original_col_upper);
      local_128.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar14 = (long)original_integrality.
                     super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)original_integrality.
                     super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (uVar14 == 0) {
        pHVar13 = (pointer)0x0;
      }
      else {
        if ((long)uVar14 < 0) {
          std::__throw_bad_alloc();
        }
        pHVar13 = (pointer)operator_new(uVar14);
      }
      local_128.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pHVar13 + uVar14;
      sVar22 = (long)original_integrality.
                     super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)original_integrality.
                     super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                     super__Vector_impl_data._M_start;
      local_128.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_start = pHVar13;
      if (sVar22 != 0) {
        local_128.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
        super__Vector_impl_data._M_finish = pHVar13;
        memmove(pHVar13,original_integrality.
                        super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                        super__Vector_impl_data._M_start,sVar22);
      }
      local_128.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_finish = pHVar13 + sVar22;
      elasticityFilterReturn
                (this,kOk,local_2b8,original_num_col,original_num_row,&original_col_cost,
                 &original_col_lower,&local_78,&local_128);
      local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (pHVar13 != (pointer)0x0) {
        operator_delete(pHVar13);
        local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
    }
    else {
      std::vector<double,_std::allocator<double>_>::vector(&local_60,&original_col_upper);
      local_108.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar14 = (long)original_integrality.
                     super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)original_integrality.
                     super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (uVar14 == 0) {
        pHVar13 = (pointer)0x0;
      }
      else {
        if ((long)uVar14 < 0) {
          std::__throw_bad_alloc();
        }
        pHVar13 = (pointer)operator_new(uVar14);
      }
      local_108.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pHVar13 + uVar14;
      sVar22 = (long)original_integrality.
                     super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)original_integrality.
                     super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                     super__Vector_impl_data._M_start;
      local_108.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_start = pHVar13;
      if (sVar22 != 0) {
        local_108.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
        super__Vector_impl_data._M_finish = pHVar13;
        memmove(pHVar13,original_integrality.
                        super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                        super__Vector_impl_data._M_start,sVar22);
      }
      local_108.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_finish = pHVar13 + sVar22;
      elasticityFilterReturn
                (this,kOk,false,original_num_col,original_num_row,&original_col_cost,
                 &original_col_lower,&local_60,&local_108);
      if (pHVar13 != (pointer)0x0) {
        operator_delete(pHVar13);
      }
    }
    return_status = kOk;
  }
  else {
    std::vector<double,_std::allocator<double>_>::vector(&local_48,&original_col_upper);
    local_e8.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar14 = (long)original_integrality.
                   super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)original_integrality.
                   super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (uVar14 == 0) {
      pHVar13 = (pointer)0x0;
    }
    else {
      if ((long)uVar14 < 0) {
        std::__throw_bad_alloc();
      }
      pHVar13 = (pointer)operator_new(uVar14);
    }
    local_e8.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pHVar13 + uVar14;
    sVar22 = (long)original_integrality.
                   super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)original_integrality.
                   super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                   super__Vector_impl_data._M_start;
    local_e8.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_start = pHVar13;
    if (sVar22 != 0) {
      local_e8.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_finish = pHVar13;
      memmove(pHVar13,original_integrality.
                      super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                      super__Vector_impl_data._M_start,sVar22);
    }
    local_e8.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_finish = pHVar13 + sVar22;
    elasticityFilterReturn
              (this,return_status,false,original_num_col,original_num_row,&original_col_cost,
               &original_col_lower,&local_48,&local_e8);
    local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (pHVar13 != (pointer)0x0) {
      operator_delete(pHVar13);
      local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
    }
  }
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_00236694:
  if (zero_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(zero_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (original_integrality.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(original_integrality.
                    super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (original_col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(original_col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (original_col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(original_col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (original_col_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(original_col_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (ecol_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(ecol_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (ecol_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(ecol_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&erow_name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&ecol_name);
  if (erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if (bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if (row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return return_status;
}

Assistant:

HighsStatus Highs::elasticityFilter(
    const double global_lower_penalty, const double global_upper_penalty,
    const double global_rhs_penalty, const double* local_lower_penalty,
    const double* local_upper_penalty, const double* local_rhs_penalty,
    const bool get_infeasible_row,
    std::vector<HighsInt>& infeasible_row_subset) {
  //  this->writeModel("infeasible.mps");
  // Solve the feasibility relaxation problem for the given penalties,
  // continuing to act as the elasticity filter get_infeasible_row is
  // true, resulting in an infeasibility subset for further refinement
  // as an IIS
  //
  // Construct the e-LP:
  //
  // Constraints L <= Ax <= U; l <= x <= u
  //
  // Transformed to
  //
  // L <= Ax + e_L - e_U <= U,
  //
  // l <=  x + e_l - e_u <= u,
  //
  // where the elastic variables are not used if the corresponding
  // bound is infinite or the local/global penalty is negative.
  //
  // x is free, and the objective is the linear function of the
  // elastic variables given by the local/global penalties
  //
  // col_of_ecol lists the column indices corresponding to the entries in
  // bound_of_col_of_ecol so that the results can be interpreted
  //
  // row_of_ecol lists the row indices corresponding to the entries in
  // bound_of_row_of_ecol so that the results can be interpreted
  std::vector<HighsInt> col_of_ecol;
  std::vector<HighsInt> row_of_ecol;
  std::vector<double> bound_of_row_of_ecol;
  std::vector<double> bound_of_col_of_ecol;
  std::vector<double> erow_lower;
  std::vector<double> erow_upper;
  std::vector<HighsInt> erow_start;
  std::vector<HighsInt> erow_index;
  std::vector<double> erow_value;
  // Accumulate names for ecols and erows, re-using ecol_name for the
  // names of row ecols after defining the names of col ecols
  std::vector<std::string> ecol_name;
  std::vector<std::string> erow_name;
  std::vector<double> ecol_cost;
  std::vector<double> ecol_lower;
  std::vector<double> ecol_upper;
  const HighsLp& lp = this->model_.lp_;
  HighsInt evar_ix = lp.num_col_;
  HighsStatus run_status;
  const bool write_model = false;
  // Take copies of the original model dimensions and column data
  // vectors, as they will be modified in forming the e-LP
  const HighsInt original_num_col = lp.num_col_;
  const HighsInt original_num_row = lp.num_row_;
  const std::vector<double> original_col_cost = lp.col_cost_;
  const std::vector<double> original_col_lower = lp.col_lower_;
  const std::vector<double> original_col_upper = lp.col_upper_;
  const std::vector<HighsVarType> original_integrality = lp.integrality_;
  // Zero the column costs
  std::vector<double> zero_costs;
  zero_costs.assign(original_num_col, 0);
  run_status = this->changeColsCost(0, lp.num_col_ - 1, zero_costs.data());
  assert(run_status == HighsStatus::kOk);

  if (get_infeasible_row && lp.integrality_.size()) {
    // Set any integrality to continuous
    std::vector<HighsVarType> all_continuous;
    all_continuous.assign(original_num_col, HighsVarType::kContinuous);
    run_status =
        this->changeColsIntegrality(0, lp.num_col_ - 1, all_continuous.data());
    assert(run_status == HighsStatus::kOk);
  }

  // For the columns
  const bool has_local_lower_penalty = local_lower_penalty;
  const bool has_global_elastic_lower = global_lower_penalty >= 0;
  const bool has_elastic_lower =
      has_local_lower_penalty || has_global_elastic_lower;
  const bool has_local_upper_penalty = local_upper_penalty;
  const bool has_global_elastic_upper = global_upper_penalty >= 0;
  const bool has_elastic_upper =
      has_local_upper_penalty || has_global_elastic_upper;
  const bool has_elastic_columns = has_elastic_lower || has_elastic_upper;
  // For the rows
  const bool has_local_rhs_penalty = local_rhs_penalty;
  const bool has_global_elastic_rhs = global_rhs_penalty >= 0;
  const bool has_elastic_rows = has_local_rhs_penalty || has_global_elastic_rhs;
  assert(has_elastic_columns || has_elastic_rows);

  const HighsInt col_ecol_offset = lp.num_col_;
  if (has_elastic_columns) {
    // Accumulate bounds to be used for columns
    std::vector<double> col_lower;
    std::vector<double> col_upper;
    // When defining names, need to know the column number
    const bool has_col_names = lp.col_names_.size() > 0;
    erow_start.push_back(0);
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      const double lower = lp.col_lower_[iCol];
      const double upper = lp.col_upper_[iCol];
      // Original bounds used unless e-variable introduced
      col_lower.push_back(lower);
      col_upper.push_back(upper);
      // Free columns have no erow
      if (lower <= -kHighsInf && upper >= kHighsInf) continue;

      // Get the penalty for violating the lower bounds on this column
      const double lower_penalty = has_local_lower_penalty
                                       ? local_lower_penalty[iCol]
                                       : global_lower_penalty;
      // Negative lower penalty and infinite upper bound implies that the
      // bounds cannot be violated
      if (lower_penalty < 0 && upper >= kHighsInf) continue;

      // Get the penalty for violating the upper bounds on this column
      const double upper_penalty = has_local_upper_penalty
                                       ? local_upper_penalty[iCol]
                                       : global_upper_penalty;
      // Infinite upper bound and negative lower penalty implies that the
      // bounds cannot be violated
      if (lower <= -kHighsInf && upper_penalty < 0) continue;
      erow_lower.push_back(lower);
      erow_upper.push_back(upper);
      if (has_col_names)
        erow_name.push_back("row_" + std::to_string(iCol) + "_" +
                            lp.col_names_[iCol] + "_erow");
      // Define the entry for x[iCol]
      erow_index.push_back(iCol);
      erow_value.push_back(1);
      if (lower > -kHighsInf && lower_penalty >= 0) {
        // New e_l variable
        col_of_ecol.push_back(iCol);
        if (has_col_names)
          ecol_name.push_back("col_" + std::to_string(iCol) + "_" +
                              lp.col_names_[iCol] + "_lower");
        // Save the original lower bound on this column and free its
        // lower bound
        bound_of_col_of_ecol.push_back(lower);
        col_lower[iCol] = -kHighsInf;
        erow_index.push_back(evar_ix);
        erow_value.push_back(1);
        ecol_cost.push_back(lower_penalty);
        evar_ix++;
      }
      if (upper < kHighsInf && upper_penalty >= 0) {
        // New e_u variable
        col_of_ecol.push_back(iCol);
        if (has_col_names)
          ecol_name.push_back("col_" + std::to_string(iCol) + "_" +
                              lp.col_names_[iCol] + "_upper");
        // Save the original upper bound on this column and free its
        // upper bound
        bound_of_col_of_ecol.push_back(upper);
        col_upper[iCol] = kHighsInf;
        erow_index.push_back(evar_ix);
        erow_value.push_back(-1);
        ecol_cost.push_back(upper_penalty);
        evar_ix++;
      }
      erow_start.push_back(erow_index.size());
      HighsInt row_nz =
          erow_start[erow_start.size() - 1] - erow_start[erow_start.size() - 2];
      //      printf("eRow for column %d has %d nonzeros\n", int(iCol),
      //      int(row_nz));
      assert(row_nz == 2 || row_nz == 3);
    }
    HighsInt num_new_col = col_of_ecol.size();
    HighsInt num_new_row = erow_start.size() - 1;
    HighsInt num_new_nz = erow_start[num_new_row];
    if (kIisDevReport)
      printf(
          "Elasticity filter: For columns there are %d variables and %d "
          "constraints\n",
          int(num_new_col), int(num_new_row));
    // Apply the original column bound changes
    assert(col_lower.size() == static_cast<size_t>(lp.num_col_));
    assert(col_upper.size() == static_cast<size_t>(lp.num_col_));
    run_status = this->changeColsBounds(0, lp.num_col_ - 1, col_lower.data(),
                                        col_upper.data());
    assert(run_status == HighsStatus::kOk);
    // Add the new columns
    ecol_lower.assign(num_new_col, 0);
    ecol_upper.assign(num_new_col, kHighsInf);
    run_status = this->addCols(num_new_col, ecol_cost.data(), ecol_lower.data(),
                               ecol_upper.data(), 0, nullptr, nullptr, nullptr);
    assert(run_status == HighsStatus::kOk);
    // Add the new rows
    assert(erow_start.size() == static_cast<size_t>(num_new_row + 1));
    assert(erow_index.size() == static_cast<size_t>(num_new_nz));
    assert(erow_value.size() == static_cast<size_t>(num_new_nz));
    run_status = this->addRows(num_new_row, erow_lower.data(),
                               erow_upper.data(), num_new_nz, erow_start.data(),
                               erow_index.data(), erow_value.data());
    assert(run_status == HighsStatus::kOk);
    if (has_col_names) {
      for (HighsInt iCol = 0; iCol < num_new_col; iCol++)
        this->passColName(col_ecol_offset + iCol, ecol_name[iCol]);
      for (HighsInt iRow = 0; iRow < num_new_row; iRow++)
        this->passRowName(original_num_row + iRow, erow_name[iRow]);
    }
    assert(ecol_cost.size() == static_cast<size_t>(num_new_col));
    assert(ecol_lower.size() == static_cast<size_t>(num_new_col));
    assert(ecol_upper.size() == static_cast<size_t>(num_new_col));
    if (write_model) {
      printf("\nAfter adding %d e-rows\n=============\n", int(num_new_col));
      bool output_flag;
      run_status = this->getOptionValue("output_flag", output_flag);
      this->setOptionValue("output_flag", true);
      this->writeModel("");
      this->setOptionValue("output_flag", output_flag);
    }
  }
  const HighsInt row_ecol_offset = lp.num_col_;
  if (has_elastic_rows) {
    // Add the columns corresponding to the e_L and e_U variables for
    // the constraints
    ecol_name.clear();
    ecol_cost.clear();
    std::vector<HighsInt> ecol_start;
    std::vector<HighsInt> ecol_index;
    std::vector<double> ecol_value;
    ecol_start.push_back(0);
    const bool has_row_names = lp.row_names_.size() > 0;
    for (HighsInt iRow = 0; iRow < original_num_row; iRow++) {
      // Get the penalty for violating the bounds on this row
      const double penalty =
          has_local_rhs_penalty ? local_rhs_penalty[iRow] : global_rhs_penalty;
      // Negative penalty implies that the bounds cannot be violated
      if (penalty < 0) continue;
      const double lower = lp.row_lower_[iRow];
      const double upper = lp.row_upper_[iRow];
      if (lower > -kHighsInf) {
        // Create an e-var for the row lower bound
        row_of_ecol.push_back(iRow);
        if (has_row_names)
          ecol_name.push_back("row_" + std::to_string(iRow) + "_" +
                              lp.row_names_[iRow] + "_lower");
        bound_of_row_of_ecol.push_back(lower);
        // Define the sub-matrix column
        ecol_index.push_back(iRow);
        ecol_value.push_back(1);
        ecol_start.push_back(ecol_index.size());
        ecol_cost.push_back(penalty);
        evar_ix++;
      }
      if (upper < kHighsInf) {
        // Create an e-var for the row upper bound
        row_of_ecol.push_back(iRow);
        if (has_row_names)
          ecol_name.push_back("row_" + std::to_string(iRow) + "_" +
                              lp.row_names_[iRow] + "_upper");
        bound_of_row_of_ecol.push_back(upper);
        // Define the sub-matrix column
        ecol_index.push_back(iRow);
        ecol_value.push_back(-1);
        ecol_start.push_back(ecol_index.size());
        ecol_cost.push_back(penalty);
        evar_ix++;
      }
    }
    HighsInt num_new_col = ecol_start.size() - 1;
    HighsInt num_new_nz = ecol_start[num_new_col];
    ecol_lower.assign(num_new_col, 0);
    ecol_upper.assign(num_new_col, kHighsInf);
    assert(ecol_cost.size() == static_cast<size_t>(num_new_col));
    assert(ecol_lower.size() == static_cast<size_t>(num_new_col));
    assert(ecol_upper.size() == static_cast<size_t>(num_new_col));
    assert(ecol_start.size() == static_cast<size_t>(num_new_col + 1));
    assert(ecol_index.size() == static_cast<size_t>(num_new_nz));
    assert(ecol_value.size() == static_cast<size_t>(num_new_nz));
    run_status = this->addCols(num_new_col, ecol_cost.data(), ecol_lower.data(),
                               ecol_upper.data(), num_new_nz, ecol_start.data(),
                               ecol_index.data(), ecol_value.data());
    assert(run_status == HighsStatus::kOk);
    if (has_row_names) {
      for (HighsInt iCol = 0; iCol < num_new_col; iCol++)
        this->passColName(row_ecol_offset + iCol, ecol_name[iCol]);
    }

    if (write_model) {
      bool output_flag;
      printf("\nAfter adding %d e-cols\n=============\n", int(num_new_col));
      run_status = this->getOptionValue("output_flag", output_flag);
      this->setOptionValue("output_flag", true);
      this->writeModel("");
      this->setOptionValue("output_flag", output_flag);
    }
  }

  if (write_model) this->writeModel("elastic.mps");

  // Lambda for gathering data when solving an LP
  auto solveLp = [&]() -> HighsStatus {
    HighsIisInfo iis_info;
    iis_info.simplex_time = -this->getRunTime();
    iis_info.simplex_iterations = -info_.simplex_iteration_count;
    run_status = this->run();
    assert(run_status == HighsStatus::kOk);
    if (run_status != HighsStatus::kOk) return run_status;
    iis_info.simplex_time += this->getRunTime();
    iis_info.simplex_iterations += info_.simplex_iteration_count;
    this->iis_.info_.push_back(iis_info);
    return run_status;
  };

  run_status = solveLp();

  if (run_status != HighsStatus::kOk)
    return elasticityFilterReturn(run_status, false, original_num_col,
                                  original_num_row, original_col_cost,
                                  original_col_lower, original_col_upper,
                                  original_integrality);
  if (kIisDevReport) this->writeSolution("", kSolutionStylePretty);
  // Model status should be optimal, unless model is unbounded
  assert(this->model_status_ == HighsModelStatus::kOptimal ||
         this->model_status_ == HighsModelStatus::kUnbounded);

  if (!get_infeasible_row)
    return elasticityFilterReturn(HighsStatus::kOk, false, original_num_col,
                                  original_num_row, original_col_cost,
                                  original_col_lower, original_col_upper,
                                  original_integrality);
  const HighsSolution& solution = this->getSolution();
  // Now fix e-variables that are positive and re-solve until e-LP is infeasible
  HighsInt loop_k = 0;
  bool feasible_model = false;
  for (;;) {
    if (kIisDevReport)
      printf("\nElasticity filter pass %d\n==============\n", int(loop_k));
    HighsInt num_fixed = 0;
    if (has_elastic_columns) {
      for (size_t eCol = 0; eCol < col_of_ecol.size(); eCol++) {
        HighsInt iCol = col_of_ecol[eCol];
        if (solution.col_value[col_ecol_offset + eCol] >
            this->options_.primal_feasibility_tolerance) {
          if (kIisDevReport)
            printf(
                "E-col %2d (column %2d) corresponds to column %2d with bound "
                "%g "
                "and has solution value %g\n",
                int(eCol), int(col_ecol_offset + eCol), int(iCol),
                bound_of_col_of_ecol[eCol],
                solution.col_value[col_ecol_offset + eCol]);
          this->changeColBounds(col_ecol_offset + eCol, 0, 0);
          num_fixed++;
        }
      }
    }
    if (has_elastic_rows) {
      for (size_t eCol = 0; eCol < row_of_ecol.size(); eCol++) {
        HighsInt iRow = row_of_ecol[eCol];
        if (solution.col_value[row_ecol_offset + eCol] >
            this->options_.primal_feasibility_tolerance) {
          if (kIisDevReport)
            printf(
                "E-row %2d (column %2d) corresponds to    row %2d with bound "
                "%g "
                "and has solution value %g\n",
                int(eCol), int(row_ecol_offset + eCol), int(iRow),
                bound_of_row_of_ecol[eCol],
                solution.col_value[row_ecol_offset + eCol]);
          this->changeColBounds(row_ecol_offset + eCol, 0, 0);
          num_fixed++;
        }
      }
    }
    if (num_fixed == 0) {
      // No elastic variables were positive, so problem is feasible
      feasible_model = true;
      break;
    }
    HighsStatus run_status = solveLp();
    if (run_status != HighsStatus::kOk)
      return elasticityFilterReturn(run_status, feasible_model,
                                    original_num_col, original_num_row,
                                    original_col_cost, original_col_lower,
                                    original_col_upper, original_integrality);
    if (kIisDevReport) this->writeSolution("", kSolutionStylePretty);
    HighsModelStatus model_status = this->getModelStatus();
    if (model_status == HighsModelStatus::kInfeasible) break;
    loop_k++;
  }

  infeasible_row_subset.clear();
  HighsInt num_enforced_col_ecol = 0;
  HighsInt num_enforced_row_ecol = 0;
  if (has_elastic_columns) {
    for (size_t eCol = 0; eCol < col_of_ecol.size(); eCol++) {
      HighsInt iCol = col_of_ecol[eCol];
      if (lp.col_upper_[col_ecol_offset + eCol] == 0) {
        num_enforced_col_ecol++;
        printf(
            "Col e-col %2d (column %2d) corresponds to column %2d with bound "
            "%g "
            "and is enforced\n",
            int(eCol), int(col_ecol_offset + eCol), int(iCol),
            bound_of_col_of_ecol[eCol]);
      }
    }
  }
  if (has_elastic_rows) {
    for (size_t eCol = 0; eCol < row_of_ecol.size(); eCol++) {
      HighsInt iRow = row_of_ecol[eCol];
      if (lp.col_upper_[row_ecol_offset + eCol] == 0) {
        num_enforced_row_ecol++;
        infeasible_row_subset.push_back(iRow);
        if (kIisDevReport)
          printf(
              "Row e-col %2d (column %2d) corresponds to    row %2d with bound "
              "%g and is enforced\n",
              int(eCol), int(row_ecol_offset + eCol), int(iRow),
              bound_of_row_of_ecol[eCol]);
      }
    }
  }
  if (feasible_model)
    assert(num_enforced_col_ecol == 0 && num_enforced_row_ecol == 0);

  highsLogUser(
      options_.log_options, HighsLogType::kInfo,
      "Elasticity filter after %d passes enforces bounds on %d cols and %d "
      "rows\n",
      int(loop_k), int(num_enforced_col_ecol), int(num_enforced_row_ecol));

  if (kIisDevReport)
    printf(
        "\nElasticity filter after %d passes enforces bounds on %d cols and %d "
        "rows\n",
        int(loop_k), int(num_enforced_col_ecol), int(num_enforced_row_ecol));

  return elasticityFilterReturn(HighsStatus::kOk, feasible_model,
                                original_num_col, original_num_row,
                                original_col_cost, original_col_lower,
                                original_col_upper, original_integrality);
}